

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O2

void __thiscall cmStateDirectory::SetCurrentBinary(cmStateDirectory *this,string *dir)

{
  string *path;
  PointerType pBVar1;
  string_view value;
  allocator<char> local_41;
  string local_40;
  
  pBVar1 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  path = &pBVar1->OutputLocation;
  std::__cxx11::string::_M_assign((string *)path);
  cmsys::SystemTools::ConvertToUnixSlashes(path);
  cmsys::SystemTools::CollapseFullPath(&local_40,path);
  std::__cxx11::string::operator=((string *)path,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_CURRENT_BINARY_DIR",&local_41);
  value._M_str = (pBVar1->OutputLocation)._M_dataplus._M_p;
  value._M_len = (pBVar1->OutputLocation)._M_string_length;
  cmStateSnapshot::SetDefinition(&this->Snapshot_,&local_40,value);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cmStateDirectory::SetCurrentBinary(std::string const& dir)
{
  std::string& loc = this->DirectoryState->OutputLocation;
  loc = dir;
  cmSystemTools::ConvertToUnixSlashes(loc);
  loc = cmSystemTools::CollapseFullPath(loc);
  this->Snapshot_.SetDefinition("CMAKE_CURRENT_BINARY_DIR", loc);
}